

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Model * gvr::loadSTL(char *name,bool merge_double_vertices)

{
  undefined8 *puVar1;
  float *pfVar2;
  uint *puVar3;
  double dVar4;
  undefined8 uVar5;
  int i;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  Mesh *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  undefined7 in_register_00000031;
  _Link_type __x;
  ulong uVar16;
  bool bVar17;
  double ret;
  Vector3f ret_3;
  Vector6d pose;
  string sheader;
  SVector<double,_3> ret_1;
  Matrix33d Rc;
  char header [81];
  istringstream in_1;
  ifstream in;
  undefined1 auStack_598 [12];
  uint local_58c;
  uint local_588;
  uint local_584;
  uint local_580;
  uint local_57c;
  Mesh *local_578;
  long local_570;
  double local_568;
  long local_560;
  double local_558;
  double dStack_550;
  ulong local_548;
  uint local_53c;
  uint local_538;
  undefined4 local_534;
  undefined1 local_530 [8];
  double local_528 [8];
  SVector<double,_6> local_4e8;
  undefined1 *local_4b8 [2];
  undefined1 local_4a8 [16];
  Vector3d local_498;
  double local_478 [12];
  Vector3f local_418 [6];
  undefined1 local_3c8;
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  local_3b8 [2];
  ios_base local_340 [264];
  long local_238 [3];
  undefined4 auStack_21c [123];
  
  local_534 = (undefined4)CONCAT71(in_register_00000031,merge_double_vertices);
  std::ifstream::ifstream(local_238);
  lVar15 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar15) = 7;
  std::ios::clear((int)(auStack_598 + lVar15) + 0x360);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)name);
  local_478[6] = 0.0;
  local_478[8] = 0.0;
  local_478[9] = 0.0;
  local_478[4] = 0.0;
  local_478[5] = 0.0;
  local_478[10] = 0.0;
  local_478[3] = 1.0;
  local_478[7] = 1.0;
  local_478[0xb] = 1.0;
  std::istream::read((char *)local_238,(long)local_418);
  local_3c8 = 0;
  local_4b8[0] = local_4a8;
  sVar14 = strlen((char *)local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,local_418,(long)local_418[0].v + sVar14);
  iVar6 = std::__cxx11::string::compare((ulong)local_4b8,0,(char *)0x8);
  if (iVar6 == 0) {
    std::__cxx11::string::substr((ulong)local_530,(ulong)local_4b8);
    std::__cxx11::istringstream::istringstream((istringstream *)local_3b8,(string *)local_530,_S_in)
    ;
    if (local_530 != (undefined1  [8])(local_528 + 1)) {
      operator_delete((void *)local_530);
    }
    local_4e8.v[4] = 0.0;
    local_4e8.v[5] = 0.0;
    local_4e8.v[2] = 0.0;
    local_4e8.v[3] = 0.0;
    local_558 = 0.0;
    dStack_550 = 0.0;
    local_4e8.v[0] = 0.0;
    local_4e8.v[1] = 0.0;
    gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_3b8,&local_4e8);
    bVar17 = *(int *)((long)&local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                     *(long *)(local_3b8[0]._M_t._M_impl._0_8_ + -0x18)) == 0;
    local_568 = 0.0;
    if (bVar17) {
      local_478[0] = local_4e8.v[3];
      local_478[1] = local_4e8.v[4];
      local_478[2] = local_4e8.v[5];
      dVar4 = 0.0;
      lVar15 = 0;
      do {
        dVar4 = dVar4 + local_478[lVar15] * local_478[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        local_498.v[0] = 0.0;
        local_498.v[1] = 0.0;
        local_498.v[2] = 0.0;
        lVar15 = 0;
        do {
          local_498.v[lVar15] = local_478[lVar15] / dVar4;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        gmath::createR((Matrix33d *)local_530,&local_498,dVar4);
      }
      else {
        local_528[2] = 0.0;
        local_528[4] = 0.0;
        local_528[5] = 0.0;
        local_528[0] = 0.0;
        local_528[1] = 0.0;
        local_528[6] = 0.0;
        local_530 = (undefined1  [8])0x3ff0000000000000;
        local_528[3] = 1.0;
        local_528[7] = 1.0;
      }
      lVar15 = 0;
      do {
        *(undefined8 *)((long)local_478 + lVar15 + 0x28) =
             *(undefined8 *)((long)local_528 + lVar15 + 8U);
        uVar5 = *(undefined8 *)((long)local_528 + lVar15);
        *(undefined8 *)((long)local_478 + lVar15 + 0x18) = *(undefined8 *)(local_530 + lVar15);
        *(undefined8 *)((long)local_478 + lVar15 + 0x20) = uVar5;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x48);
      local_558 = local_4e8.v[0];
      dStack_550 = local_4e8.v[1];
      local_568 = local_4e8.v[2];
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base(local_340);
  }
  else {
    local_558 = 0.0;
    dStack_550 = 0.0;
    local_568 = 0.0;
    bVar17 = false;
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0]);
  }
  uVar7 = std::istream::get();
  iVar6 = std::istream::get();
  iVar8 = std::istream::get();
  iVar9 = std::istream::get();
  this = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(this);
  uVar7 = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
  local_548 = (ulong)uVar7;
  if (bVar17) {
    lVar15 = 0;
    do {
      *(undefined8 *)((long)(this->super_PointCloud).super_Model.Rc.v[0] + lVar15 + 0x10) =
           *(undefined8 *)((long)local_478 + lVar15 + 0x28);
      uVar5 = *(undefined8 *)((long)local_478 + lVar15 + 0x20);
      puVar1 = (undefined8 *)((long)(this->super_PointCloud).super_Model.Rc.v[0] + lVar15);
      *puVar1 = *(undefined8 *)((long)local_478 + lVar15 + 0x18);
      puVar1[1] = uVar5;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x48);
    (this->super_PointCloud).super_Model.Tc.v[0] = local_558;
    (this->super_PointCloud).super_Model.Tc.v[1] = dStack_550;
    (this->super_PointCloud).super_Model.Tc.v[2] = local_568;
  }
  local_53c = uVar7 * 3;
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,(ulong)local_53c,0,0);
  (*(this->super_PointCloud).super_Model._vptr_Model[10])(this);
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header;
  __x = (_Link_type)0x0;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4e8.v[0] = (double)((ulong)local_4e8.v[0] & 0xffffffff00000000);
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar7 != 0) {
    local_568 = (double)((ulong)local_568 & 0xffffffff00000000);
    local_578 = this;
    do {
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      local_418[0].v[0] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      local_418[0].v[1] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      local_418[0].v[2] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      if ((char)local_534 == '\0') {
        local_558 = (double)((ulong)local_4e8.v[0] & 0xffffffff);
        local_4e8.v[0] = (double)CONCAT44(local_4e8.v[0]._4_4_,local_4e8.v[0]._0_4_ + 3);
        uVar7 = std::istream::get();
        local_570._0_4_ = uVar7;
        uVar10 = std::istream::get();
        local_560 = CONCAT44(local_560._4_4_,uVar10);
        local_580 = std::istream::get();
        iVar6 = std::istream::get();
        local_584 = std::istream::get();
        iVar8 = std::istream::get();
        local_588 = std::istream::get();
        iVar9 = std::istream::get();
        local_58c = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        lVar15 = (long)local_558._0_4_;
        pfVar2 = (local_578->super_PointCloud).vertex;
        pfVar2[lVar15 * 3] =
             (float)(iVar6 << 0x18 | local_580 << 0x10 | (int)local_560 << 8 | (uint)local_570);
        pfVar2[lVar15 * 3 + 1] = (float)(iVar9 << 0x18 | local_588 << 0x10 | iVar8 << 8 | local_584)
        ;
        pfVar2[lVar15 * 3 + 2] = (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_58c);
        local_560 = lVar15;
        uVar10 = std::istream::get();
        local_570 = CONCAT44(local_570._4_4_,uVar10);
        local_580 = std::istream::get();
        local_584 = std::istream::get();
        iVar6 = std::istream::get();
        local_588 = std::istream::get();
        iVar8 = std::istream::get();
        local_58c = std::istream::get();
        iVar9 = std::istream::get();
        local_57c = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        lVar15 = local_560 + 1;
        pfVar2 = (local_578->super_PointCloud).vertex;
        pfVar2[lVar15 * 3] =
             (float)(iVar6 << 0x18 | local_584 << 0x10 | local_580 << 8 | (uint)local_570);
        pfVar2[lVar15 * 3 + 1] = (float)(iVar9 << 0x18 | local_58c << 0x10 | iVar8 << 8 | local_588)
        ;
        pfVar2[lVar15 * 3 + 2] = (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_57c);
        local_570 = lVar15;
        local_580 = std::istream::get();
        local_584 = std::istream::get();
        local_588 = std::istream::get();
        iVar6 = std::istream::get();
        local_58c = std::istream::get();
        iVar8 = std::istream::get();
        local_57c = std::istream::get();
        iVar9 = std::istream::get();
        local_538 = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        uVar16 = local_560 + 2;
        pfVar2 = (local_578->super_PointCloud).vertex;
        pfVar2[uVar16 * 3] = (float)(iVar6 << 0x18 | local_588 << 0x10 | local_584 << 8 | local_580)
        ;
        pfVar2[uVar16 * 3 + 1] = (float)(iVar9 << 0x18 | local_57c << 0x10 | iVar8 << 8 | local_58c)
        ;
        pfVar2[uVar16 * 3 + 2] = (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_538);
        this = local_578;
      }
      else {
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_528[0]._0_4_ = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)&local_4e8,(Vector3f *)local_530,local_418);
        local_558 = (double)CONCAT44(extraout_var,uVar7);
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_528[0]._0_4_ = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)&local_4e8,(Vector3f *)local_530,local_418);
        local_570 = CONCAT44(extraout_var_00,uVar7);
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_530._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_528[0] = (double)CONCAT44(local_528[0]._4_4_,
                                        iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)&local_4e8,(Vector3f *)local_530,local_418);
        uVar16 = (ulong)uVar7;
      }
      puVar3 = this->triangle;
      lVar15 = (long)local_568._0_4_;
      puVar3[lVar15] = SUB84(local_558,0);
      puVar3[lVar15 + 1] = (uint)local_570;
      puVar3[lVar15 + 2] = (uint)uVar16;
      std::istream::ignore((long)local_238);
      std::istream::ignore((long)local_238);
      local_568 = (double)CONCAT44(local_568._4_4_,local_568._0_4_ + 3);
      uVar7 = (int)local_548 - 1;
      local_548 = (ulong)uVar7;
    } while (uVar7 != 0);
    __x = (_Link_type)((ulong)local_4e8.v[0] & 0xffffffff);
  }
  if ((int)__x < (int)local_53c) {
    (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,__x,0,0);
  }
  Mesh::recalculateNormals(this);
  std::
  _Rb_tree<gvr::(anonymous_namespace)::VertexNormalIndex,_gvr::(anonymous_namespace)::VertexNormalIndex,_std::_Identity<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  ::_M_erase((_Rb_tree<gvr::(anonymous_namespace)::VertexNormalIndex,_gvr::(anonymous_namespace)::VertexNormalIndex,_std::_Identity<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
              *)local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return (Model *)this;
}

Assistant:

Model *loadSTL(const char *name, bool merge_double_vertices)
{
  Mesh *mesh=0;

  // open file

  std::ifstream in;

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // read header

  gmath::Matrix33d Rc;
  gmath::Vector3d Tc;
  bool has_campose=false;

  {
    char header[81];

    in.read(header, 80);
    header[80]='\0';

    std::string sheader(header);

    if (sheader.compare(0, 8, "campose=") == 0)
    {
      std::istringstream in(sheader.substr(8));

      gmath::Vector6d pose;
      in >> pose;

      if (in.good())
      {
        Rc=gmath::getRotation(pose);
        Tc=gmath::getTranslation(pose);
        has_campose=true;
      }
    }
  }

  // read number of trinagles

  uint32_t n;
  n=stlReadUint32(in);

  try
  {
    // create mesh

    mesh=new Mesh();

    if (has_campose)
    {
      mesh->setDefCameraRT(Rc, Tc);
    }

    mesh->resizeVertexList(3*n, false, false);
    mesh->resizeTriangleList(n);

    std::set<VertexNormalIndex> vni;

    // read all triangles

    int vn=0;

    for (uint32_t i=0; i<n; i++)
    {
      // read triangle normal

      gmath::Vector3f tnormal=stlReadVector3f(in);

      // read vertices and either find a duplicate or add them

      unsigned int t0, t1, t2;

      if (merge_double_vertices)
      {
        t0=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t1=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t2=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
      }
      else
      {
        t0=vn++;
        t1=vn++;
        t2=vn++;

        mesh->setVertex(t0, stlReadVector3f(in));
        mesh->setVertex(t1, stlReadVector3f(in));
        mesh->setVertex(t2, stlReadVector3f(in));
      }

      // store triangle indices

      mesh->setTriangleIndex(i, t0, t1, t2);

      // skip padding

      in.ignore(1);
      in.ignore(1);
    }

    // reduce list of vertices

    if (vn < static_cast<int>(3*n))
    {
      mesh->resizeVertexList(vn, false, false);
    }

    // calculate per vertex normals

    mesh->recalculateNormals();
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  in.close();

  return mesh;
}